

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O1

pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
* pstore::index::details::internal_node::get_node
            (pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
             *__return_storage_ptr__,database *db,index_pointer node)

{
  shared_ptr<const_pstore::index::details::internal_node> store_internal;
  signature_type local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  if (((ulong)node.internal_ & 2) == 0) {
    read_node((internal_node *)&local_20,db,
              (typed_address<pstore::index::details::internal_node>)
              ((ulong)node.internal_ & 0xfffffffffffffffc));
    (__return_storage_ptr__->first).
    super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_20._M_elems;
    (__return_storage_ptr__->first).
    super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->first).
    super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_18;
    __return_storage_ptr__->second = (internal_node *)local_20._M_elems;
  }
  else {
    (__return_storage_ptr__->first).
    super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->first).
    super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __return_storage_ptr__->second = node.internal_ & 0xfffffffffffffffc;
  }
  return __return_storage_ptr__;
}

Assistant:

auto internal_node::get_node (database const & db, index_pointer const node)
                -> std::pair<std::shared_ptr<internal_node const>, internal_node const *> {

                if (node.is_heap ()) {
                    return {nullptr, node.untag<internal_node *> ()};
                }

                std::shared_ptr<internal_node const> store_internal =
                    internal_node::read_node (db, node.untag_address<internal_node> ());
                auto const * const p = store_internal.get ();
                return {std::move (store_internal), p};
            }